

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_EnhancedFixedWingAircraft *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GED_EnhancedFixedWingAircraft *local_18;
  GED_EnhancedFixedWingAircraft *this_local;
  
  local_18 = this;
  this_local = (GED_EnhancedFixedWingAircraft *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  GED_BasicFixedWingAircraft::GetAsString_abi_cxx11_
            (&local_1c0,&this->super_GED_BasicFixedWingAircraft);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190,"GED Enhanced Fixed Wing Aircraft\n");
  poVar1 = std::operator<<(poVar1,"\tFuel Status:               ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SupFuelStatus);
  poVar1 = std::operator<<(poVar1,"0 Liters\n");
  poVar1 = std::operator<<(poVar1,"\tAir Maintenance Status:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8AirMaintStatus);
  poVar1 = std::operator<<(poVar1,"0 km\n");
  poVar1 = std::operator<<(poVar1,"\tPrimary Ammunition:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8PriAmmun);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSecondary Ammunition:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SecAmmun);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_EnhancedFixedWingAircraft::GetAsString() const
{
    KStringStream ss;

    ss << GED_BasicFixedWingAircraft::GetAsString();

    ss << "GED Enhanced Fixed Wing Aircraft\n"
       << "\tFuel Status:               " << ( KUINT16 )m_ui8SupFuelStatus   << "0 Liters\n"
       << "\tAir Maintenance Status:    " << ( KUINT16 )m_ui8AirMaintStatus  << "0 km\n"
       << "\tPrimary Ammunition:        " << ( KUINT16 )m_ui8PriAmmun        << "\n"
       << "\tSecondary Ammunition:      " << ( KUINT16 )m_ui8SecAmmun        << "\n";

    return ss.str();
}